

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool __thiscall
QCborArray::comparesEqual_helper(QCborArray *this,QCborArray *lhs,QCborValueConstRef rhs)

{
  QCborContainerPrivate *pQVar1;
  int iVar2;
  
  pQVar1 = lhs[6].d.d.ptr;
  if ((int)(&pQVar1->usedData)[(long)rhs.d * 2] == 0x80) {
    iVar2 = compareContainer((this->d).d.ptr,
                             *(QCborContainerPrivate **)
                              (&pQVar1->super_QSharedData + (long)rhs.d * 4),ForEquality);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

const T *data() const noexcept { return ptr; }